

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,minstd_rand *rng)

{
  pointer piVar1;
  bool bVar2;
  entry_type eVar3;
  __type _Var4;
  int32_t iVar5;
  uint uVar6;
  uint uVar7;
  Dictionary *this_00;
  result_type_conflict rVar8;
  int32_t wid;
  string token;
  int32_t local_74;
  minstd_rand *local_70;
  param_type local_68;
  undefined1 local_50 [32];
  
  local_68 = (param_type)vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50[0x10] = 0;
  this_00 = this;
  local_70 = rng;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  uVar6 = 0;
  while (bVar2 = readWord(this_00,in,(string *)local_50), uVar7 = uVar6, bVar2) {
    this_00 = this;
    iVar5 = find(this,(string *)local_50);
    local_74 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar5];
    if (-1 < local_74) {
      eVar3 = getType(this,local_74);
      iVar5 = local_74;
      if (eVar3 == word) {
        rVar8 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&local_68,local_70);
        bVar2 = discard(this,iVar5,(float)rVar8);
        if (!bVar2) {
          std::vector<int,_std::allocator<int>_>::push_back(words,&local_74);
        }
      }
      uVar7 = uVar6 + 1;
      if ((0x3ff < uVar6) ||
         (this_00 = (Dictionary *)local_50,
         _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)EOS_abi_cxx11_), uVar6 = uVar7, _Var4)) break;
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return uVar7;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::minstd_rand& rng) const {
  std::uniform_real_distribution<> uniform(0, 1);
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  while (readWord(in, token)) {
    int32_t h = find(token);
    int32_t wid = word2int_[h];
    if (wid < 0) {
      continue;
    }

    ntokens++;
    if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
      words.push_back(wid);
    }
    if (ntokens > MAX_LINE_SIZE || token == EOS) {
      break;
    }
  }
  return ntokens;
}